

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

QString * QFileSystemEngine::resolveGroupName(uint groupId)

{
  long lVar1;
  group *data;
  __gid_t in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  group *gr;
  QString *size;
  undefined4 in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  size = in_RDI;
  data = getgrgid(in_ESI);
  if (data == (group *)0x0) {
    QString::QString((QString *)0x2111e6);
  }
  else {
    QByteArray::QByteArray
              ((QByteArray *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),(char *)data,(qsizetype)size
              );
    QFile::decodeName((QByteArray *)in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x2111db);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return size;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileSystemEngine::resolveGroupName(uint groupId)
{
#if QT_CONFIG(thread) && defined(_POSIX_THREAD_SAFE_FUNCTIONS) && !defined(Q_OS_OPENBSD)
    long size_max = sysconf(_SC_GETPW_R_SIZE_MAX);
    if (size_max == -1)
        size_max = 1024;
    QVarLengthArray<char, 1024> buf(size_max);
#endif

#if !defined(Q_OS_INTEGRITY) && !defined(Q_OS_WASM)
    struct group *gr = nullptr;
#if QT_CONFIG(thread) && defined(_POSIX_THREAD_SAFE_FUNCTIONS) && !defined(Q_OS_OPENBSD) && !defined(Q_OS_VXWORKS) && (!defined(Q_OS_ANDROID) || defined(Q_OS_ANDROID) && (__ANDROID_API__ >= 24))
    size_max = sysconf(_SC_GETGR_R_SIZE_MAX);
    if (size_max == -1)
        size_max = 1024;
    buf.resize(size_max);
    struct group entry;
    // Some large systems have more members than the POSIX max size
    // Loop over by doubling the buffer size (upper limit 250k)
    for (long size = size_max; size < 256000; size += size)
    {
        buf.resize(size);
        // ERANGE indicates that the buffer was too small
        if (!getgrgid_r(groupId, &entry, buf.data(), buf.size(), &gr)
            || errno != ERANGE)
            break;
    }
#else
    gr = getgrgid(groupId);
#endif
    if (gr)
        return QFile::decodeName(QByteArray(gr->gr_name));
#else // Integrity || WASM || VxWorks
    Q_UNUSED(groupId);
#endif
    return QString();
}